

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O3

bool __thiscall S2Polygon::BoundaryNear(S2Polygon *this,S2Polygon *b,S1Angle max_error)

{
  __uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_> b_00;
  __uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_> this_00;
  bool bVar1;
  int iVar2;
  pointer puVar3;
  pointer puVar4;
  long lVar5;
  long lVar6;
  
  puVar3 = (this->loops_).
           super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (this->loops_).
           super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar2 = (int)((ulong)((long)puVar4 - (long)puVar3) >> 3);
  if (iVar2 == (int)((ulong)((long)(b->loops_).
                                   super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(b->loops_).
                                  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    if (0 < iVar2) {
      lVar5 = 0;
LAB_0020ad87:
      iVar2 = (int)((ulong)((long)puVar4 - (long)puVar3) >> 3);
      if (0 < iVar2) {
        b_00._M_t.super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
        super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl =
             puVar3[lVar5]._M_t.super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t;
        lVar6 = 0;
        do {
          this_00._M_t.super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
          super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl =
               (b->loops_).
               super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar6]._M_t.
               super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t;
          if (*(int *)((long)this_00._M_t.
                             super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                             super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl + 8) ==
              *(int *)((long)b_00._M_t.
                             super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                             super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl + 8)) {
            bVar1 = S2Loop::BoundaryNear
                              ((S2Loop *)
                               this_00._M_t.
                               super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                               super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl,
                               (S2Loop *)
                               b_00._M_t.
                               super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                               super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl,max_error);
            puVar3 = (this->loops_).
                     super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar4 = (this->loops_).
                     super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (bVar1) goto LAB_0020ade0;
          }
          lVar6 = lVar6 + 1;
          if ((int)((ulong)((long)puVar4 - (long)puVar3) >> 3) <= lVar6) break;
        } while( true );
      }
      goto LAB_0020adf6;
    }
    bVar1 = true;
  }
  else {
LAB_0020adf6:
    bVar1 = false;
  }
  return bVar1;
LAB_0020ade0:
  lVar5 = lVar5 + 1;
  if ((int)((ulong)((long)puVar4 - (long)puVar3) >> 3) <= lVar5) {
    return 0 < iVar2;
  }
  goto LAB_0020ad87;
}

Assistant:

bool S2Polygon::BoundaryNear(const S2Polygon& b, S1Angle max_error) const {
  if (num_loops() != b.num_loops()) return false;

  // For now, we assume that there is at most one candidate match for each
  // loop.  (So far this method is just used for testing.)

  for (int i = 0; i < num_loops(); ++i) {
    const S2Loop& a_loop = *loop(i);
    bool success = false;
    for (int j = 0; j < num_loops(); ++j) {
      const S2Loop& b_loop = *b.loop(j);
      if (b_loop.depth() == a_loop.depth() &&
          b_loop.BoundaryNear(a_loop, max_error)) {
        success = true;
        break;
      }
    }
    if (!success) return false;
  }
  return true;
}